

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_fwd_txfm2d_test.cc
# Opt level: O2

void __thiscall
anon_unknown.dwarf_15c76d4::AV1FwdTxfm2dTest_match_Test::TestBody(AV1FwdTxfm2dTest_match_Test *this)

{
  byte bVar1;
  bool bVar2;
  uint16_t uVar3;
  uint uVar4;
  ParamType *pPVar5;
  ulong uVar6;
  ushort *puVar7;
  Message *message;
  int c_1;
  long lVar8;
  int *lhs;
  long lVar9;
  SEARCH_METHODS *message_00;
  int c;
  int iVar10;
  ulong uVar11;
  int *rhs;
  ulong uVar12;
  ACMRandom rnd;
  AssertionResult gtest_ar;
  TxfmParam param;
  int16_t input [4096];
  int32_t ref_output [4096];
  int32_t output [4096];
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_a118;
  uint local_a10c;
  int local_a108;
  ACMRandom local_a104;
  ulong local_a100;
  AssertHelper local_a0f8;
  uint local_a0f0;
  uint local_a0ec;
  uint local_a0e8;
  int local_a0e4;
  uint local_a0e0;
  uint local_a0dc;
  ulong local_a0d8;
  internal local_a0d0 [8];
  __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_a0c8;
  txfm_param local_a0c0;
  code *local_a0a0;
  ulong local_a098;
  long local_a090;
  _func_void_short_ptr_int_ptr_int_txfm_param_ptr *local_a088;
  int *local_a080;
  int *local_a078;
  ulong local_a070;
  ulong local_a068;
  ushort local_a060 [4096];
  int local_8060 [4096];
  int local_4060 [4108];
  
  pPVar5 = testing::
           WithParamInterface<std::tuple<unsigned_char,_void_(*)(const_short_*,_int_*,_int,_txfm_param_*)>_>
           ::GetParam();
  bVar1 = (pPVar5->
          super__Tuple_impl<0UL,_unsigned_char,_void_(*)(const_short_*,_int_*,_int,_txfm_param_*)>).
          super__Head_base<0UL,_unsigned_char,_false>._M_head_impl;
  uVar6 = (ulong)bVar1;
  pPVar5 = testing::
           WithParamInterface<std::tuple<unsigned_char,_void_(*)(const_short_*,_int_*,_int,_txfm_param_*)>_>
           ::GetParam();
  local_a088 = (pPVar5->
               super__Tuple_impl<0UL,_unsigned_char,_void_(*)(const_short_*,_int_*,_int,_txfm_param_*)>
               ).super__Tuple_impl<1UL,_void_(*)(const_short_*,_int_*,_int,_txfm_param_*)>.
               super__Head_base<1UL,_void_(*)(const_short_*,_int_*,_int,_txfm_param_*),_false>.
               _M_head_impl;
  local_a0c0.tx_set_type = '\0';
  local_a0c0._17_3_ = 0;
  local_a0c0.eob = 0;
  local_a0c0.tx_type = '\0';
  local_a0c0.tx_size = '\0';
  local_a0c0._2_2_ = 0;
  local_a0c0.lossless = 0;
  local_a0c0.bd = 0;
  local_a0c0.is_hbd = 0;
  local_a0f0 = ::tx_size_high[bVar1];
  local_a0ec = ::tx_size_wide[bVar1];
  local_a0e0 = 0x20;
  if ((int)local_a0ec < 0x20) {
    local_a0e0 = local_a0ec;
  }
  local_a0e4 = local_a0ec * local_a0f0;
  uVar12 = 0;
  if (0 < (int)local_a0ec) {
    uVar12 = (ulong)local_a0ec;
  }
  local_a070 = 0;
  if (0 < (int)local_a0f0) {
    local_a070 = (ulong)local_a0f0;
  }
  local_a068 = 0;
  if (0 < (int)local_a0e0) {
    local_a068 = (ulong)local_a0e0;
  }
  lVar9 = local_a070 * 0x80;
  local_a090 = (long)(int)local_a0e0 << 2;
  uVar4 = 0;
  local_a0e8 = (uint)bVar1;
  local_a0d8 = uVar6;
LAB_0062cf75:
  if (uVar4 == 0x10) {
    return;
  }
  local_a0dc = uVar4 & 0xff;
  bVar2 = libaom_test::IsTxSizeTypeValid((TX_SIZE)uVar6,(TX_TYPE)uVar4);
  if (bVar2) {
    local_a0a0 = *(code **)(libaom_test::fwd_txfm_func_ls + local_a0d8 * 8);
    iVar10 = 0;
    local_a10c = uVar4;
    memset(local_a060,0,0x2000);
    local_a104.random_.state_ = (Random)0xbaba;
    do {
      local_a108 = iVar10;
      if (iVar10 == 0) {
        puVar7 = local_a060;
        for (uVar6 = 0; uVar6 != uVar12; uVar6 = uVar6 + 1) {
          for (lVar8 = 0; lVar9 != lVar8; lVar8 = lVar8 + 0x80) {
            *(undefined2 *)((long)puVar7 + lVar8) = 0xff;
          }
          puVar7 = puVar7 + 1;
        }
      }
      else {
        if (iVar10 == 500) goto LAB_0062d1a5;
        uVar6 = 0;
        while (uVar6 != local_a070) {
          local_a100 = uVar6;
          for (uVar11 = 0; uVar12 != uVar11; uVar11 = uVar11 + 1) {
            uVar3 = libaom_test::ACMRandom::Rand16(&local_a104);
            local_a060[(ulong)((uint)uVar6 & 0x3ffffff) * 0x40 + uVar11] = uVar3 & 0xff;
          }
          uVar6 = local_a100 + 1;
        }
      }
      local_a0c0.tx_size = (TX_SIZE)local_a0d8;
      local_a0c0.tx_type = (TX_TYPE)local_a0dc;
      local_a0c0.tx_set_type = '\x05';
      local_a0c0.bd = 8;
      (*local_a0a0)(local_a060,local_8060,0x40,local_a0dc,8);
      rhs = local_4060;
      (*local_a088)((short *)local_a060,rhs,0x40,&local_a0c0);
      uVar4 = local_a0e4 / (int)local_a0e0;
      if (0x1f < (int)uVar4) {
        uVar4 = 0x20;
      }
      if ((int)uVar4 < 1) {
        uVar4 = 0;
      }
      local_a098 = (ulong)uVar4;
      lhs = local_8060;
      uVar6 = 0;
      while (uVar6 != local_a098) {
        local_a100 = uVar6;
        local_a080 = rhs;
        local_a078 = lhs;
        for (uVar11 = 0; local_a068 != uVar11; uVar11 = uVar11 + 1) {
          testing::internal::CmpHelperEQ<int,int>
                    (local_a0d0,"ref_output[r * check_cols + c]","output[r * check_cols + c]",lhs,
                     rhs);
          if (local_a0d0[0] == (internal)0x0) {
            testing::Message::Message((Message *)&local_a118);
            std::operator<<((ostream *)(local_a118._M_head_impl + 0x10),"[");
            iVar10 = local_a108;
            std::ostream::operator<<(local_a118._M_head_impl + 0x10,(int)local_a100);
            std::operator<<((ostream *)(local_a118._M_head_impl + 0x10),",");
            std::ostream::operator<<(local_a118._M_head_impl + 0x10,(int)uVar11);
            std::operator<<((ostream *)(local_a118._M_head_impl + 0x10),"] cnt:");
            std::ostream::operator<<(local_a118._M_head_impl + 0x10,iVar10);
            std::operator<<((ostream *)(local_a118._M_head_impl + 0x10)," tx_size: ");
            std::ostream::operator<<(local_a118._M_head_impl + 0x10,local_a0ec);
            std::operator<<((ostream *)(local_a118._M_head_impl + 0x10),"x");
            std::ostream::operator<<(local_a118._M_head_impl + 0x10,local_a0f0);
            std::operator<<((ostream *)(local_a118._M_head_impl + 0x10)," tx_type: ");
            message = testing::Message::operator<<
                                ((Message *)&local_a118,
                                 (char **)(libaom_test::tx_type_name + (ulong)local_a10c * 8));
            if (local_a0c8._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl ==
                (_Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )0x0) {
              message_00 = "";
            }
            else {
              message_00 = *(SEARCH_METHODS **)
                            local_a0c8._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl;
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_a0f8,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/av1_fwd_txfm2d_test.cc"
                       ,0x11f,(char *)message_00);
            testing::internal::AssertHelper::operator=(&local_a0f8,message);
            testing::internal::AssertHelper::~AssertHelper(&local_a0f8);
            if (local_a118._M_head_impl !=
                (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              (**(code **)(*(long *)local_a118._M_head_impl + 8))();
            }
            std::
            unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&local_a0c8);
            return;
          }
          std::
          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&local_a0c8);
          rhs = rhs + 1;
          lhs = lhs + 1;
        }
        rhs = (int *)((long)local_a080 + local_a090);
        lhs = (int *)((long)local_a078 + local_a090);
        uVar6 = local_a100 + 1;
      }
      iVar10 = local_a108 + 1;
    } while( true );
  }
  goto LAB_0062d1aa;
LAB_0062d1a5:
  local_a108 = 500;
  uVar4 = local_a10c;
LAB_0062d1aa:
  uVar4 = uVar4 + 1;
  uVar6 = (ulong)local_a0e8;
  goto LAB_0062cf75;
}

Assistant:

TEST_P(AV1FwdTxfm2dTest, match) {
  AV1FwdTxfm2dMatchTest(GET_PARAM(0), GET_PARAM(1));
}